

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O0

void FRandom::StaticWriteRNGState(FSerializer *arc)

{
  bool bVar1;
  FSerializer *pFVar2;
  FRandom *local_18;
  FRandom *rng;
  FSerializer *arc_local;
  
  FSerializer::operator()(arc,"rngseed",&rngseed);
  bVar1 = FSerializer::BeginArray(arc,"rngs");
  if (bVar1) {
    for (local_18 = RNGList; local_18 != (FRandom *)0x0; local_18 = local_18->Next) {
      if ((local_18->NameCRC != 0) && (bVar1 = FSerializer::BeginObject(arc,(char *)0x0), bVar1)) {
        pFVar2 = FSerializer::operator()(arc,"crc",&local_18->NameCRC);
        pFVar2 = FSerializer::operator()(pFVar2,"index",&local_18->idx);
        pFVar2 = FSerializer::Array<unsigned_int>(pFVar2,"u",(local_18->sfmt).u,0x14,false);
        FSerializer::EndObject(pFVar2);
      }
    }
    FSerializer::EndArray(arc);
  }
  return;
}

Assistant:

void FRandom::StaticWriteRNGState (FSerializer &arc)
{
	FRandom *rng;

	arc("rngseed", rngseed);

	if (arc.BeginArray("rngs"))
	{
		for (rng = FRandom::RNGList; rng != NULL; rng = rng->Next)
		{
			// Only write those RNGs that have names
			if (rng->NameCRC != 0)
			{
				if (arc.BeginObject(nullptr))
				{
					arc("crc", rng->NameCRC)
						("index", rng->idx)
						.Array("u", rng->sfmt.u, SFMT::N32)
						.EndObject();
				}
			}
		}
		arc.EndArray();
	}
}